

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

mg_server * mg_create_server(void *server_data,mg_handler_t handler)

{
  mg_server *s;
  mg_server *server;
  mg_handler_t handler_local;
  void *server_data_local;
  
  s = (mg_server *)calloc(1,200);
  ns_mgr_init((ns_mgr *)s,server_data);
  set_default_option_values(s->config_options);
  s->event_handler = handler;
  return s;
}

Assistant:

struct mg_server *mg_create_server(void *server_data, mg_handler_t handler) {
  struct mg_server *server = (struct mg_server *) calloc(1, sizeof(*server));
  ns_mgr_init(&server->ns_mgr, server_data);
  set_default_option_values(server->config_options);
  server->event_handler = handler;
  return server;
}